

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FG_SolverMaxPlus.cpp
# Opt level: O1

double __thiscall FG_SolverMaxPlus::Solve(FG_SolverMaxPlus *this)

{
  list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *plVar1;
  pointer pcVar2;
  int iVar3;
  size_t sVar4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  bool bVar7;
  char cVar8;
  long lVar9;
  ostream *poVar10;
  undefined8 *puVar11;
  char *fg;
  int iVar12;
  _List_node_base *p_Var13;
  ulong uVar14;
  double dVar15;
  Properties props;
  MaxPlus mp;
  tms ts_after;
  tms ts_before;
  stringstream ss;
  _List_node_base *local_600;
  long *local_5f8;
  long local_5f0;
  long local_5e8 [2];
  double local_5d8;
  long *local_5d0;
  long local_5c8;
  long local_5c0 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
  local_5b0;
  undefined1 local_580 [456];
  _List_node_base *local_3b8 [7];
  tms local_380;
  tms local_360;
  PropertyValue local_340 [2];
  undefined1 local_330 [112];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  times(&local_360);
  local_5b0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_5b0._M_impl.super__Rb_tree_header._M_header;
  local_5b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_5b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_5b0._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar2 = local_580 + 0x10;
  local_5b0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_5b0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_580._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_580,"maxiter","");
  local_340[0].content = (placeholder *)operator_new(0x10);
  (local_340[0].content)->_vptr_placeholder = (_func_int **)&PTR__placeholder_0059eda0;
  local_340[0].content[1]._vptr_placeholder = (_func_int **)(this->super_MaxPlusSolver)._m_maxiter;
  libDAI::Properties::Set((Properties *)&local_5b0,(PropertyKey *)local_580,local_340);
  if (local_340[0].content != (placeholder *)0x0) {
    (*(local_340[0].content)->_vptr_placeholder[1])();
  }
  if ((pointer)local_580._0_8_ != pcVar2) {
    operator_delete((void *)local_580._0_8_,local_580._16_8_ + 1);
  }
  iVar3 = (this->super_MaxPlusSolver)._m_verbosity;
  iVar12 = 3;
  if (3 < iVar3) {
    iVar12 = iVar3;
  }
  local_580._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_580,"verbose","");
  local_340[0].content = (placeholder *)operator_new(0x10);
  (local_340[0].content)->_vptr_placeholder = (_func_int **)&PTR__placeholder_0059eda0;
  local_340[0].content[1]._vptr_placeholder = (_func_int **)(ulong)(iVar12 - 3);
  libDAI::Properties::Set((Properties *)&local_5b0,(PropertyKey *)local_580,local_340);
  if (local_340[0].content != (placeholder *)0x0) {
    (*(local_340[0].content)->_vptr_placeholder[1])();
  }
  if ((pointer)local_580._0_8_ != pcVar2) {
    operator_delete((void *)local_580._0_8_,local_580._16_8_ + 1);
  }
  local_580._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_580,"updates","");
  boost::any::any<std::__cxx11::string&>
            (local_340,&(this->super_MaxPlusSolver)._m_updateType,(type *)0x0,(type *)0x0);
  libDAI::Properties::Set((Properties *)&local_5b0,(PropertyKey *)local_580,local_340);
  if (local_340[0].content != (placeholder *)0x0) {
    (*(local_340[0].content)->_vptr_placeholder[1])();
  }
  if ((pointer)local_580._0_8_ != pcVar2) {
    operator_delete((void *)local_580._0_8_,local_580._16_8_ + 1);
  }
  local_580._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_580,"damping","");
  local_340[0].content = (placeholder *)operator_new(0x10);
  (local_340[0].content)->_vptr_placeholder = (_func_int **)&PTR__placeholder_0059ee50;
  local_340[0].content[1]._vptr_placeholder = (_func_int **)(this->super_MaxPlusSolver)._m_damping;
  libDAI::Properties::Set((Properties *)&local_5b0,(PropertyKey *)local_580,local_340);
  if (local_340[0].content != (placeholder *)0x0) {
    (*(local_340[0].content)->_vptr_placeholder[1])();
  }
  if ((pointer)local_580._0_8_ != pcVar2) {
    operator_delete((void *)local_580._0_8_,local_580._16_8_ + 1);
  }
  local_580._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_580,"tol","");
  local_340[0].content = (placeholder *)operator_new(0x10);
  (local_340[0].content)->_vptr_placeholder = (_func_int **)&PTR__placeholder_0059ee50;
  local_340[0].content[1]._vptr_placeholder = (_func_int **)0x3f847ae147ae147b;
  libDAI::Properties::Set((Properties *)&local_5b0,(PropertyKey *)local_580,local_340);
  if (local_340[0].content != (placeholder *)0x0) {
    (*(local_340[0].content)->_vptr_placeholder[1])();
  }
  if ((pointer)local_580._0_8_ != pcVar2) {
    operator_delete((void *)local_580._0_8_,local_580._16_8_ + 1);
  }
  fg = (char *)(this->super_FG_Solver)._m_fg;
  libDAI::MaxPlus::MaxPlus
            ((MaxPlus *)local_580,(FactorGraph *)fg,(Properties *)&local_5b0,
             (this->super_MaxPlusSolver)._m_nrSolutions);
  if ((this->super_MaxPlusSolver)._m_nrRestarts != 0) {
    uVar14 = 1;
    do {
      if (3 < (this->super_MaxPlusSolver)._m_verbosity) {
        fg = "New MaxPlus restart...";
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"New MaxPlus restart...",0x16);
      }
      libDAI::MaxPlus::init((MaxPlus *)local_580,(EVP_PKEY_CTX *)fg);
      dVar15 = libDAI::MaxPlus::run((MaxPlus *)local_580);
      if (0.0 < this->_m_deadlineInSeconds) {
        times(&local_380);
        local_5d8 = (double)(local_380.tms_utime - local_360.tms_utime);
        lVar9 = sysconf(2);
        if (this->_m_deadlineInSeconds < local_5d8 / (double)lVar9) {
          puVar11 = (undefined8 *)__cxa_allocate_exception(0x30);
          *puVar11 = &PTR__E_0059bd80;
          puVar11[1] = puVar11 + 3;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(puVar11 + 1),"MaxPlus deadline exceeded","");
          *puVar11 = &PTR__E_0059ce68;
          puVar11[5] = 0;
          __cxa_throw(puVar11,&EDeadline::typeinfo,E::~E);
        }
      }
      if (3 < (this->super_MaxPlusSolver)._m_verbosity) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Found solution with value=",0x1a);
        poVar10 = std::ostream::_M_insert<double>(dVar15);
        cVar8 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        fg = (char *)(ulong)(uint)(int)cVar8;
        std::ostream::put((char)poVar10);
        std::ostream::flush();
      }
      bVar7 = uVar14 < (this->super_MaxPlusSolver)._m_nrRestarts;
      uVar14 = (ulong)((int)uVar14 + 1);
    } while (bVar7);
  }
  plVar1 = &(this->super_FG_Solver)._m_bestConfs;
  if (plVar1 != (list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                 *)local_3b8) {
    std::__cxx11::
    list<std::pair<double,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<double,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
    ::
    _M_assign_dispatch<std::_List_const_iterator<std::pair<double,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
              ((list<std::pair<double,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<double,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
                *)plVar1,local_3b8[0]);
  }
  sVar4 = (this->super_FG_Solver)._m_bestConfs.
          super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          ._M_impl._M_node._M_size;
  if (0 < (this->super_MaxPlusSolver)._m_verbosity) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"found ",6);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," configurations",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
  }
  if (sVar4 == 0) {
    local_600 = (_List_node_base *)0x0;
  }
  else {
    p_Var5 = (this->super_FG_Solver)._m_bestConfs.
             super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    local_600 = p_Var5[1]._M_next;
    if (1 < (this->super_MaxPlusSolver)._m_verbosity) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"best value:",0xb);
      poVar10 = std::ostream::_M_insert<double>((double)local_600);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
    }
    if (2 < (this->super_MaxPlusSolver)._m_verbosity) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"best configuration:\n",0x14);
      std::__cxx11::stringstream::stringstream(local_1b8);
      p_Var13 = p_Var5[1]._M_prev;
      p_Var6 = p_Var5[2]._M_next;
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"< ",2);
      if (p_Var13 != p_Var6) {
        do {
          if (p_Var13 != p_Var5[1]._M_prev) {
            std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
          }
          std::__cxx11::stringstream::stringstream((stringstream *)local_340);
          std::ostream::_M_insert<unsigned_long>((ulong)local_330);
          std::__cxx11::stringbuf::str();
          std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
          std::ios_base::~ios_base(local_2c0);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_5f8,local_5f0);
          if (local_5f8 != local_5e8) {
            operator_delete(local_5f8,local_5e8[0] + 1);
          }
          p_Var13 = (_List_node_base *)&p_Var13->_M_prev;
        } while (p_Var13 != p_Var6);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8," >",2);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)local_5d0,local_5c8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      if (local_5d0 != local_5c0) {
        operator_delete(local_5d0,local_5c0[0] + 1);
      }
    }
  }
  libDAI::MaxPlus::~MaxPlus((MaxPlus *)local_580);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
  ::~_Rb_tree(&local_5b0);
  return (double)local_600;
}

Assistant:

double FG_SolverMaxPlus::Solve()
{
    tms ts_before, ts_after;
    times(&ts_before);

    libDAI::Properties props;
    props.Set("maxiter",_m_maxiter);
    //cout <<"FG_SolverMaxPlus::Solve() - _m_verbosity="<<_m_verbosity<<endl;
    size_t verb = (size_t) std::max( (_m_verbosity-3), 0 );
    props.Set("verbose", verb);
    props.Set("updates",_m_updateType);
    props.Set("damping",_m_damping);
    double  tol = 1e-2;
    props.Set("tol",tol);    
    libDAI::MaxPlus mp (*_m_fg, props, _m_nrSolutions);
    for(Index restI=0; restI < _m_nrRestarts; restI++)
    {
        if(_m_verbosity >= 4)
            cout << "New MaxPlus restart...";

        mp.init();
        /* GetWriteAnyTimeResults, GetResultsOFStream, GetTimingsOFStream
           are defined by BayesianGameIdenticalPayoffSolver_T< JointPolicyPureVector >
           we do not really need this (at this point at least) so let's not bother for now
           ----------
           if(GetWriteAnyTimeResults())
            mp.SetAnyTimeResults(true,
                                 GetResultsOFStream(),
                                 GetTimingsOFStream());*/
        double value = mp.run();

        if(_m_deadlineInSeconds>0)
        {
            times(&ts_after);
            clock_t utime = ts_after.tms_utime -
                ts_before.tms_utime;
            double timeSpentInS=static_cast<double>(utime) / sysconf(_SC_CLK_TCK);
            if(timeSpentInS>_m_deadlineInSeconds)
                throw(EDeadline("MaxPlus deadline exceeded"));
        }
        if(_m_verbosity >= 4)
            cout << "Found solution with value="<<value<<endl;
    }

    //save the best configurations found by max-plus...
    //const std::vector<size_t> & config = mp.GetBestConfiguration();
    //we make a copy, when mp dies, its configs go with it...
    _m_bestConfs = mp.GetBestConfigurations();



    size_t nrConfsFound = _m_bestConfs.size();
    if(_m_verbosity >= 1)
        cout << "found "<< nrConfsFound <<" configurations"<<endl;

    double value = 0.0;
    if(nrConfsFound > 0)
    {
        libDAI::MADP_util::valConf& vc = _m_bestConfs.front();
        value = vc.first;
        std::vector<size_t>& sol_vec = vc.second;
        if(_m_verbosity >= 2)
            cout << "best value:"<<value<<endl;
        if(_m_verbosity >= 3)
            cout << "best configuration:\n"<<
                PrintTools::SoftPrintVector(sol_vec)<<endl;
        return (value);
    }
    else
        return(0.0);

}